

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O2

void __thiscall deqp::egl::ResizeTest::~ResizeTest(ResizeTest *this)

{
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ResizeTest_01e02d78;
  tcu::ResultCollector::~ResultCollector(&this->m_status);
  de::details::UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>::
  ~UniqueBase(&(this->m_context).
               super_UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>);
  de::details::UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::
  ~UniqueBase(&(this->m_surface).
               super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>);
  de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::~UniqueBase
            (&(this->m_nativeWindow).
              super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>);
  egl::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

ResizeTest	(EglTestContext&		eglTestCtx,
											 const ResizeParams&	params)
									: TestCase	(eglTestCtx,
												 params.name.c_str(),
												 params.description.c_str())
									, m_oldSize	(params.oldSize)
									, m_newSize	(params.newSize)
									, m_display	(EGL_NO_DISPLAY)
									, m_config	(DE_NULL)
									, m_log		(m_testCtx.getLog())
									, m_status	(m_log) {}